

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * google::protobuf::internal::ReadTag(char *p,uint32_t *out,uint32_t param_3)

{
  byte bVar1;
  char *pcVar2;
  uint32_t res;
  pair<const_char_*,_unsigned_int> pVar3;
  
  bVar1 = *p;
  if ((char)bVar1 < '\0') {
    res = ((uint)(byte)p[1] * 0x80 + (uint)bVar1) - 0x80;
    if (p[1] < '\0') {
      pVar3 = ReadTagFallback(p,res);
      pcVar2 = pVar3.first;
      *out = pVar3.second;
    }
    else {
      *out = res;
      pcVar2 = p + 2;
    }
  }
  else {
    *out = (uint)bVar1;
    pcVar2 = p + 1;
  }
  return pcVar2;
}

Assistant:

inline const char* ReadTag(const char* p, uint32_t* out,
                           uint32_t /*max_tag*/ = 0) {
  uint32_t res = static_cast<uint8_t>(p[0]);
  if (res < 128) {
    *out = res;
    return p + 1;
  }
  uint32_t second = static_cast<uint8_t>(p[1]);
  res += (second - 1) << 7;
  if (second < 128) {
    *out = res;
    return p + 2;
  }
  auto tmp = ReadTagFallback(p, res);
  *out = tmp.second;
  return tmp.first;
}